

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall
QMdiAreaPrivate::updateActiveWindow(QMdiAreaPrivate *this,int removedIndex,bool activeRemoved)

{
  int iVar1;
  pointer piVar2;
  QMdiSubWindow *child;
  int i;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  for (uVar3 = 0; uVar3 < (ulong)(this->indicesToActivatedChildren).d.size; uVar3 = uVar3 + 1) {
    piVar2 = QList<int>::data(&this->indicesToActivatedChildren);
    if (removedIndex < piVar2[uVar3]) {
      piVar2[uVar3] = piVar2[uVar3] + -1;
    }
  }
  if (-1 < removedIndex && (QObject *)this->tabBar != (QObject *)0x0) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker((QSignalBlocker *)local_48,(QObject *)this->tabBar);
    QTabBar::removeTab(&this->tabBar->super_QTabBar,removedIndex);
    updateTabBarGeometry(this);
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_48);
  }
  if ((this->childWindows).d.size == 0) {
    this->showActiveWindowMaximized = false;
    resetActiveWindow(this,(QMdiSubWindow *)0x0);
  }
  else {
    iVar1 = this->indexToHighlighted;
    if (-1 < iVar1) {
      if (iVar1 == removedIndex) {
        hideRubberBand(this);
      }
      else if (removedIndex < iVar1) {
        this->indexToHighlighted = iVar1 + -1;
      }
    }
    if (activeRemoved) {
      child = nextVisibleSubWindow(this,0,this->activationOrder,removedIndex,-1);
      if (child != (QMdiSubWindow *)0x0) {
        activateWindow(this,child);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::updateActiveWindow(int removedIndex, bool activeRemoved)
{
    Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());

    // Update indices list first so that we don't rely
    for (int i = 0; i < indicesToActivatedChildren.size(); ++i) {
        int &index = indicesToActivatedChildren[i];
        if (index > removedIndex)
            --index;
    }

#if QT_CONFIG(tabbar)
    if (tabBar && removedIndex >= 0) {
        const QSignalBlocker blocker(tabBar);
        tabBar->removeTab(removedIndex);
        updateTabBarGeometry();
    }
#endif

    if (childWindows.isEmpty()) {
        showActiveWindowMaximized = false;
        resetActiveWindow();
        return;
    }

    if (indexToHighlighted >= 0) {
#if QT_CONFIG(rubberband)
        // Hide rubber band if highlighted window is removed.
        if (indexToHighlighted == removedIndex)
            hideRubberBand();
        else
#endif
        // or update index if necessary.
        if (indexToHighlighted > removedIndex)
            --indexToHighlighted;
    }

    if (!activeRemoved)
        return;

    // Activate next window.
    QMdiSubWindow *next = nextVisibleSubWindow(0, activationOrder, removedIndex);
    if (next)
        activateWindow(next);
}